

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_binder.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::GroupBinder::BindSelectRef(BindResult *__return_storage_ptr__,GroupBinder *this,idx_t entry)

{
  vector<duckdb::DummyBinding,_true> *pvVar1;
  _Hash_node_base *p_Var2;
  SelectNode *pSVar3;
  mapped_type mVar4;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  bool bVar6;
  undefined1 *puVar7;
  undefined8 uVar8;
  char cVar9;
  BoundConstantExpression *this_01;
  reference pvVar10;
  pointer pPVar11;
  mapped_type *pmVar12;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var13;
  BinderException *this_02;
  __hash_code __code;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  __node_base_ptr p_Var17;
  __node_base_ptr p_Var18;
  __hashtable *__h;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> binding;
  type select_entry;
  string __str;
  string __str_1;
  undefined1 local_e0 [40];
  undefined1 local_b8 [64];
  BindResult *local_78;
  undefined1 local_70 [64];
  
  uVar14 = (this->used_aliases)._M_h._M_bucket_count;
  uVar15 = entry % uVar14;
  p_Var17 = (this->used_aliases)._M_h._M_buckets[uVar15];
  p_Var18 = (__node_base_ptr)0x0;
  if ((p_Var17 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var17->_M_nxt, p_Var18 = p_Var17,
     p_Var17->_M_nxt[1]._M_nxt != (_Hash_node_base *)entry)) {
    while (p_Var17 = p_Var2, p_Var2 = p_Var17->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var18 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar14 != uVar15) ||
         (p_Var18 = p_Var17, p_Var2[1]._M_nxt == (_Hash_node_base *)entry)) goto LAB_00e11291;
    }
    p_Var18 = (__node_base_ptr)0x0;
  }
LAB_00e11291:
  local_e0._8_8_ = entry;
  if ((p_Var18 == (__node_base_ptr)0x0) || (p_Var18->_M_nxt == (_Hash_node_base *)0x0)) {
    pSVar3 = this->node;
    if ((ulong)((long)(pSVar3->select_list).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pSVar3->select_list).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= entry) {
      this_02 = (BinderException *)__cxa_allocate_exception(0x10);
      local_b8._0_8_ = local_b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_e0 + 0x28),
                 "GROUP BY term out of range - should be between 1 and %d","");
      BinderException::BinderException<int>
                (this_02,(string *)(local_e0 + 0x28),
                 (int)((ulong)((long)(this->node->select_list).
                                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->node->select_list).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3));
      __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar10 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](&pSVar3->select_list,entry);
    pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(pvVar10);
    (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[0xc])(local_e0 + 0x28,pPVar11);
    uVar8 = local_b8._0_8_;
    local_b8._0_8_ = (vector<duckdb::DummyBinding,_true> *)0x0;
    _Var13._M_head_impl =
         (this->unbound_expression).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (this->unbound_expression).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar8;
    if (_Var13._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var13._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((vector<duckdb::DummyBinding,_true> *)local_b8._0_8_ !=
        (vector<duckdb::DummyBinding,_true> *)0x0) {
      (**(code **)(*(long *)&(((vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                                *)local_b8._0_8_)->
                             super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                             )._M_impl.super__Vector_impl_data + 8))();
    }
    pvVar10 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](&this->node->select_list,local_e0._8_8_);
    local_e0._32_8_ =
         (pvVar10->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar10->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_e0,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)this,(LogicalType *)(local_e0 + 0x20),false);
    uVar8 = local_e0._8_8_;
    cVar16 = '\x01';
    if (9 < (ulong)local_e0._8_8_) {
      uVar14 = local_e0._8_8_;
      cVar9 = '\x04';
      do {
        cVar16 = cVar9;
        if (uVar14 < 100) {
          cVar16 = cVar16 + -2;
          goto LAB_00e1141e;
        }
        if (uVar14 < 1000) {
          cVar16 = cVar16 + -1;
          goto LAB_00e1141e;
        }
        if (uVar14 < 10000) goto LAB_00e1141e;
        bVar6 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar9 = cVar16 + '\x04';
      } while (bVar6);
      cVar16 = cVar16 + '\x01';
    }
LAB_00e1141e:
    mVar4 = this->bind_index;
    this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)this->group_alias_map;
    puVar7 = local_b8 + 0x10;
    local_b8._0_8_ = puVar7;
    local_78 = __return_storage_ptr__;
    ::std::__cxx11::string::_M_construct((ulong)(local_e0 + 0x28),cVar16);
    ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8._0_8_,local_b8._8_4_,uVar8);
    pmVar12 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[](this_00,(key_type *)(local_e0 + 0x28));
    *pmVar12 = mVar4;
    if ((undefined1 *)local_b8._0_8_ != puVar7) {
      operator_delete((void *)local_b8._0_8_);
    }
    uVar8 = local_e0._8_8_;
    cVar16 = '\x01';
    if (9 < (ulong)local_e0._8_8_) {
      uVar14 = local_e0._8_8_;
      cVar9 = '\x04';
      do {
        cVar16 = cVar9;
        if (uVar14 < 100) {
          cVar16 = cVar16 + -2;
          goto LAB_00e114d6;
        }
        if (uVar14 < 1000) {
          cVar16 = cVar16 + -1;
          goto LAB_00e114d6;
        }
        if (uVar14 < 10000) goto LAB_00e114d6;
        bVar6 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar9 = cVar16 + '\x04';
      } while (bVar6);
      cVar16 = cVar16 + '\x01';
    }
LAB_00e114d6:
    pvVar1 = (vector<duckdb::DummyBinding,_true> *)(local_70 + 0x10);
    local_70._0_8_ = pvVar1;
    ::std::__cxx11::string::_M_construct((ulong)local_70,cVar16);
    ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70._0_8_,local_70._8_4_,uVar8);
    _Var13._M_head_impl = (ParsedExpression *)operator_new(0x50);
    if ((vector<duckdb::DummyBinding,_true> *)local_70._0_8_ == pvVar1) {
      local_b8._24_8_ = local_70._24_8_;
      local_b8._0_8_ = puVar7;
    }
    else {
      local_b8._0_8_ = local_70._0_8_;
    }
    local_b8._8_8_ = local_70._8_8_;
    local_70._8_8_ = (element_type *)0x0;
    local_70[0x10] = 0;
    local_70._0_8_ = pvVar1;
    ColumnRefExpression::ColumnRefExpression
              ((ColumnRefExpression *)_Var13._M_head_impl,(string *)(local_e0 + 0x28));
    if ((undefined1 *)local_b8._0_8_ != puVar7) {
      operator_delete((void *)local_b8._0_8_);
    }
    pvVar10 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](&this->node->select_list,local_e0._8_8_);
    _Var5._M_head_impl =
         (pvVar10->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar10->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var13._M_head_impl;
    if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((vector<duckdb::DummyBinding,_true> *)local_70._0_8_ != pvVar1) {
      operator_delete((void *)local_70._0_8_);
    }
    local_b8._0_8_ = &this->used_aliases;
    ::std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->used_aliases,local_e0 + 8);
    __return_storage_ptr__ = local_78;
    local_e0._16_8_ = local_e0._0_8_;
    local_e0._0_8_ = (_func_int **)0x0;
    BindResult::BindResult
              (local_78,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(local_e0 + 0x10));
    if ((element_type *)local_e0._16_8_ != (element_type *)0x0) {
      (*(*(_func_int ***)local_e0._16_8_)[1])();
    }
    local_e0._16_8_ = (element_type *)0x0;
    if ((_func_int **)local_e0._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_e0._0_8_ + 8))();
    }
    if ((DummyBinding *)local_e0._32_8_ != (DummyBinding *)0x0) {
      (*((Binding *)local_e0._32_8_)->_vptr_Binding[1])();
    }
  }
  else {
    Value::INTEGER((Value *)local_70,0x2a);
    this_01 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)(local_e0 + 0x28),(Value *)local_70);
    BoundConstantExpression::BoundConstantExpression(this_01,(Value *)(local_e0 + 0x28));
    Value::~Value((Value *)(local_e0 + 0x28));
    local_e0._24_8_ = this_01;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               (local_e0 + 0x18));
    if ((BoundConstantExpression *)local_e0._24_8_ != (BoundConstantExpression *)0x0) {
      (*(((Expression *)local_e0._24_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_e0._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Value::~Value((Value *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult GroupBinder::BindSelectRef(idx_t entry) {
	if (used_aliases.find(entry) != used_aliases.end()) {
		// the alias has already been bound to before!
		// this happens if we group on the same alias twice
		// e.g. GROUP BY k, k or GROUP BY 1, 1
		// in this case, we can just replace the grouping with a constant since the second grouping has no effect
		// (the constant grouping will be optimized out later)
		return BindResult(make_uniq<BoundConstantExpression>(Value::INTEGER(42)));
	}
	if (entry >= node.select_list.size()) {
		throw BinderException("GROUP BY term out of range - should be between 1 and %d", (int)node.select_list.size());
	}
	// we replace the root expression, also replace the unbound expression
	unbound_expression = node.select_list[entry]->Copy();
	// move the expression that this refers to here and bind it
	auto select_entry = std::move(node.select_list[entry]);
	auto binding = Bind(select_entry, nullptr, false);
	// now replace the original expression in the select list with a reference to this group
	group_alias_map[to_string(entry)] = bind_index;
	node.select_list[entry] = make_uniq<ColumnRefExpression>(to_string(entry));
	// insert into the set of used aliases
	used_aliases.insert(entry);
	return BindResult(std::move(binding));
}